

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JHandler.cpp
# Opt level: O0

void __thiscall JHandler::JHandler(JHandler *this,string *cfg)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  value_variant_data *pvVar5;
  key_value_vec_t *pkVar6;
  key_value_t *pkVar7;
  value_variant *pvVar8;
  string *psVar9;
  string *e;
  undefined1 local_c0 [8];
  document doc;
  string *cfg_local;
  JHandler *this_local;
  
  std::make_shared<JHandler::url>();
  std::make_shared<JHandler::metadata>();
  std::__cxx11::string::string((string *)&this->error_msg);
  this->status = false;
  pjson::document::document((document *)local_c0,0,0x1000,0);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (cfg);
  bVar1 = pjson::document::deserialize_in_place((document *)local_c0,pcVar2);
  if (!bVar1) {
    e._4_1_ = 1;
    psVar9 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar9,"Error, bad data. [doc.deserialize_in_place()]",
               (allocator<char> *)((long)&e + 5));
    e._4_1_ = 0;
    __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar1 = pjson::value_variant::has_key((value_variant *)local_c0,"status");
  if ((bVar1) && (bVar1 = pjson::value_variant::has_key((value_variant *)local_c0,"data"), bVar1)) {
    pvVar8 = pjson::value_variant::operator[]((value_variant *)local_c0,"status");
    bVar1 = pjson::value_variant::as_bool(pvVar8,false);
    this->status = bVar1;
    pvVar8 = pjson::value_variant::operator[]((value_variant *)local_c0,"data");
    pvVar5 = &pjson::value_variant::operator[](pvVar8,"file")->super_value_variant_data;
    pkVar6 = pjson::value_variant_data::get_object(pvVar5);
    pkVar7 = pjson::
             simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
             ::operator[](pkVar6,0);
    pvVar8 = pjson::key_value_t::get_value(pkVar7);
    pvVar8 = pjson::value_variant::operator[](pvVar8,0);
    pcVar2 = pjson::value_variant::as_string_ptr(pvVar8);
    peVar3 = std::__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar3->str_full,pcVar2);
    pvVar8 = pjson::value_variant::operator[]((value_variant *)local_c0,"data");
    pvVar5 = &pjson::value_variant::operator[](pvVar8,"file")->super_value_variant_data;
    pkVar6 = pjson::value_variant_data::get_object(pvVar5);
    pkVar7 = pjson::
             simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
             ::operator[](pkVar6,0);
    pvVar8 = pjson::key_value_t::get_value(pkVar7);
    pvVar8 = pjson::value_variant::operator[](pvVar8,1);
    pcVar2 = pjson::value_variant::as_string_ptr(pvVar8);
    peVar3 = std::__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar3->str_short,pcVar2);
    pvVar8 = pjson::value_variant::operator[]((value_variant *)local_c0,"data");
    pvVar5 = &pjson::value_variant::operator[](pvVar8,"file")->super_value_variant_data;
    pkVar6 = pjson::value_variant_data::get_object(pvVar5);
    pkVar7 = pjson::
             simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
             ::operator[](pkVar6,1);
    pvVar8 = pjson::key_value_t::get_value(pkVar7);
    pvVar8 = pjson::value_variant::operator[](pvVar8,0);
    pcVar2 = pjson::value_variant::as_string_ptr(pvVar8);
    peVar4 = std::__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->MD_ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar4->id,pcVar2);
    pvVar8 = pjson::value_variant::operator[]((value_variant *)local_c0,"data");
    pvVar5 = &pjson::value_variant::operator[](pvVar8,"file")->super_value_variant_data;
    pkVar6 = pjson::value_variant_data::get_object(pvVar5);
    pkVar7 = pjson::
             simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
             ::operator[](pkVar6,1);
    pvVar8 = pjson::key_value_t::get_value(pkVar7);
    pvVar8 = pjson::value_variant::operator[](pvVar8,1);
    pcVar2 = pjson::value_variant::as_string_ptr(pvVar8);
    peVar4 = std::__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->MD_ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar4->name,pcVar2);
    pvVar8 = pjson::value_variant::operator[]((value_variant *)local_c0,"data");
    pvVar8 = pjson::value_variant::operator[](pvVar8,"file");
    pvVar8 = pjson::value_variant::operator[](pvVar8,"metadata");
    pvVar5 = &pjson::value_variant::operator[](pvVar8,"size")->super_value_variant_data;
    pkVar6 = pjson::value_variant_data::get_object(pvVar5);
    pkVar7 = pjson::
             simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
             ::operator[](pkVar6,1);
    pvVar8 = pjson::key_value_t::get_value(pkVar7);
    pcVar2 = pjson::value_variant::as_string_ptr(pvVar8);
    peVar4 = std::__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->MD_ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&peVar4->size,pcVar2);
  }
  else {
    bVar1 = pjson::value_variant::has_key((value_variant *)local_c0,"error");
    if (!bVar1) {
      e._6_1_ = 1;
      psVar9 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (psVar9,"Error, bad JSON format, key [status] not found.",
                 (allocator<char> *)((long)&e + 7));
      e._6_1_ = 0;
      __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pvVar5 = &pjson::value_variant::operator[]((value_variant *)local_c0,"error")->
              super_value_variant_data;
    pkVar6 = pjson::value_variant_data::get_object(pvVar5);
    pkVar7 = pjson::
             simple_vector<pjson::key_value_t,_true,_pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>_>
             ::operator[](pkVar6,0);
    pvVar8 = pjson::key_value_t::get_value(pkVar7);
    pcVar2 = pjson::value_variant::as_string_ptr(pvVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->error_msg,pcVar2);
  }
  pjson::document::~document((document *)local_c0);
  return;
}

Assistant:

JHandler::JHandler(const std::string &cfg) {
  status = false;
  pjson::document doc;
  try {
    if (doc.deserialize_in_place(const_cast<char*>(cfg.c_str()))) {
      if (doc.has_key("status") && doc.has_key("data")) {
        status = doc["status"].as_bool();
        url_ptr->str_full = doc["data"]["file"].get_object()[0].get_value()[0].as_string_ptr();
        url_ptr->str_short = doc["data"]["file"].get_object()[0].get_value()[1].as_string_ptr();
        MD_ptr->id = doc["data"]["file"].get_object()[1].get_value()[0].as_string_ptr();
        MD_ptr->name = doc["data"]["file"].get_object()[1].get_value()[1].as_string_ptr();
        MD_ptr->size = doc["data"]["file"]["metadata"]["size"].get_object()[1].get_value().as_string_ptr();

#ifdef DEBUG
        std::cout << "[DEBUG|CFG] : status is: " << status << std::endl;
        std::cout << "[DEBUG|CFG] : url full is: " << url_ptr->str_full << std::endl;
        std::cout << "[DEBUG|CFG] : url short is: " << url_ptr->str_short << std::endl;
        std::cout << "[DEBUG|CFG] MD id is: " << MD_ptr->id << std::endl;
        std::cout << "[DEBUG|CFG] MD name is: " << MD_ptr->name << std::endl;
        std::cout << "[DEBUG|CFG] MD size is: " << MD_ptr->size << std::endl;
#endif

      } else if(doc.has_key("error")) {
        error_msg = doc["error"].get_object()[0].get_value().as_string_ptr();
#ifdef DEBUG
        std::cout << "[DEBUG|CFG] error_msg : " << error_msg << std::endl;
#endif
      }
      else
        throw std::string("Error, bad JSON format, key [status] not found.");
    } else
      throw std::string("Error, bad data. [doc.deserialize_in_place()]");
  }
  catch(const std::string& e) {
    std::cerr << e << std::endl;
  }
}